

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

float tinyobj::parseFloat(char **token)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  pcVar10 = *token;
  sVar4 = strspn(pcVar10," \t");
  pcVar10 = pcVar10 + sVar4;
  *token = pcVar10;
  sVar4 = strcspn(pcVar10," \t\r");
  pcVar1 = pcVar10 + sVar4;
  fVar11 = 0.0;
  if ((long)sVar4 < 1) goto LAB_00119095;
  cVar2 = *pcVar10;
  if ((cVar2 == '-') || (cVar2 == '+')) {
    pcVar10 = pcVar10 + 1;
    dVar13 = *(double *)(&DAT_00174fb0 + (ulong)(cVar2 == '+') * 8);
  }
  else {
    if (9 < (int)cVar2 - 0x30U) goto LAB_00119095;
    dVar13 = 1.0;
  }
  dVar14 = 0.0;
  iVar5 = 0;
  for (pcVar8 = pcVar10; pcVar8 != pcVar1; pcVar8 = pcVar8 + 1) {
    cVar2 = *pcVar8;
    uVar3 = (uint)cVar2;
    if (9 < uVar3 - 0x30) {
      if (iVar5 == 0) goto LAB_00119095;
      if ((cVar2 == 'e') || (cVar2 == 'E')) goto LAB_00118fe4;
      iVar5 = 0;
      if (cVar2 != '.') goto LAB_00119063;
      iVar9 = -1;
      goto LAB_00118f74;
    }
    dVar14 = dVar14 * 10.0 + (double)(int)(uVar3 - 0x30);
    iVar5 = iVar5 + -1;
  }
  iVar5 = 0;
  if ((int)pcVar1 == (int)pcVar10) goto LAB_00119095;
  goto LAB_00119063;
LAB_00118f74:
  pcVar8 = pcVar8 + 1;
  iVar5 = 0;
  if (pcVar8 == pcVar1) goto LAB_00119063;
  uVar3 = (uint)*pcVar8;
  if (9 < uVar3 - 0x30) goto LAB_00118fe4;
  dVar12 = pow(10.0,(double)iVar9);
  dVar14 = dVar14 + dVar12 * (double)(int)(uVar3 - 0x30);
  iVar9 = iVar9 + -1;
  goto LAB_00118f74;
LAB_00118fe4:
  fVar11 = 0.0;
  iVar5 = 0;
  if ((uVar3 & 0xff | 0x20) == 0x65) {
    pcVar10 = pcVar8 + 1;
    cVar2 = pcVar8[1];
    if ((pcVar10 == pcVar1) || ((cVar2 != '-' && (cVar2 != '+')))) {
      if (9 < (int)cVar2 - 0x30U) goto LAB_00119095;
      iVar9 = 1;
    }
    else {
      pcVar10 = pcVar8 + 2;
      iVar9 = (uint)(cVar2 == '+') * 2 + -1;
    }
    iVar6 = (int)pcVar1 - (int)pcVar10;
    iVar5 = 0;
    for (lVar7 = 0; pcVar10 + lVar7 != pcVar1; lVar7 = lVar7 + 1) {
      uVar3 = (int)pcVar10[lVar7] - 0x30;
      if (9 < uVar3) {
        iVar6 = (int)lVar7;
        break;
      }
      iVar5 = uVar3 + iVar5 * 10;
    }
    if (iVar6 == 0) goto LAB_00119095;
    iVar5 = iVar5 * iVar9;
  }
LAB_00119063:
  dVar12 = pow(5.0,(double)iVar5);
  dVar14 = ldexp(dVar12 * dVar14,iVar5);
  fVar11 = (float)(dVar13 * dVar14);
LAB_00119095:
  *token = pcVar1;
  return fVar11;
}

Assistant:

static inline float parseFloat(const char *&token) {
  token += strspn(token, " \t");
#ifdef TINY_OBJ_LOADER_OLD_FLOAT_PARSER
  float f = (float)atof(token);
  token += strcspn(token, " \t\r");
#else
  const char *end = token + strcspn(token, " \t\r");
  double val = 0.0;
  tryParseDouble(token, end, &val);
  float f = static_cast<float>(val);
  token = end;
#endif
  return f;
}